

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::WindowDataParameter::InternalSwap(WindowDataParameter *this,WindowDataParameter *other)

{
  InternalMetadataWithArena *this_00;
  float fVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  string *psVar5;
  void *pvVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  UnknownFieldSet *pUVar8;
  UnknownFieldSet *pUVar9;
  
  psVar5 = (this->source_).ptr_;
  (this->source_).ptr_ = (other->source_).ptr_;
  (other->source_).ptr_ = psVar5;
  psVar5 = (this->mean_file_).ptr_;
  (this->mean_file_).ptr_ = (other->mean_file_).ptr_;
  (other->mean_file_).ptr_ = psVar5;
  psVar5 = (this->crop_mode_).ptr_;
  (this->crop_mode_).ptr_ = (other->crop_mode_).ptr_;
  (other->crop_mode_).ptr_ = psVar5;
  psVar5 = (this->root_folder_).ptr_;
  (this->root_folder_).ptr_ = (other->root_folder_).ptr_;
  (other->root_folder_).ptr_ = psVar5;
  uVar3 = this->batch_size_;
  this->batch_size_ = other->batch_size_;
  other->batch_size_ = uVar3;
  uVar3 = this->crop_size_;
  this->crop_size_ = other->crop_size_;
  other->crop_size_ = uVar3;
  bVar2 = this->mirror_;
  this->mirror_ = other->mirror_;
  other->mirror_ = bVar2;
  bVar2 = this->cache_images_;
  this->cache_images_ = other->cache_images_;
  other->cache_images_ = bVar2;
  uVar3 = this->context_pad_;
  this->context_pad_ = other->context_pad_;
  other->context_pad_ = uVar3;
  fVar1 = this->scale_;
  this->scale_ = other->scale_;
  other->scale_ = fVar1;
  fVar1 = this->fg_threshold_;
  this->fg_threshold_ = other->fg_threshold_;
  other->fg_threshold_ = fVar1;
  fVar1 = this->bg_threshold_;
  this->bg_threshold_ = other->bg_threshold_;
  other->bg_threshold_ = fVar1;
  fVar1 = this->fg_fraction_;
  this->fg_fraction_ = other->fg_fraction_;
  other->fg_fraction_ = fVar1;
  uVar3 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar3;
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar6 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar9 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar9 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar6 = (this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_;
    if (((ulong)pvVar6 & 1) == 0) {
      pUVar8 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(this->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
    }
    else {
      pUVar8 = (UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe);
    }
    pvVar7 = pUVar8->fields_;
    pUVar8->fields_ = pUVar9->fields_;
    pUVar9->fields_ = pvVar7;
  }
  iVar4 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar4;
  return;
}

Assistant:

void WindowDataParameter::InternalSwap(WindowDataParameter* other) {
  source_.Swap(&other->source_);
  mean_file_.Swap(&other->mean_file_);
  crop_mode_.Swap(&other->crop_mode_);
  root_folder_.Swap(&other->root_folder_);
  std::swap(batch_size_, other->batch_size_);
  std::swap(crop_size_, other->crop_size_);
  std::swap(mirror_, other->mirror_);
  std::swap(cache_images_, other->cache_images_);
  std::swap(context_pad_, other->context_pad_);
  std::swap(scale_, other->scale_);
  std::swap(fg_threshold_, other->fg_threshold_);
  std::swap(bg_threshold_, other->bg_threshold_);
  std::swap(fg_fraction_, other->fg_fraction_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}